

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxu32 SyStrlen(char *zSrc)

{
  char *pcVar1;
  char *zIn;
  
  pcVar1 = zSrc + 3;
  do {
    if (pcVar1[-3] == '\0') {
      pcVar1 = pcVar1 + -3;
LAB_0010be45:
      return (int)pcVar1 - (int)zSrc;
    }
    if (pcVar1[-2] == '\0') {
      pcVar1 = pcVar1 + -2;
      goto LAB_0010be45;
    }
    if (pcVar1[-1] == '\0') {
      pcVar1 = pcVar1 + -1;
      goto LAB_0010be45;
    }
    if (*pcVar1 == '\0') goto LAB_0010be45;
    pcVar1 = pcVar1 + 4;
  } while( true );
}

Assistant:

JX9_PRIVATE sxu32 SyStrlen(const char *zSrc)
{
	register const char *zIn = zSrc;
#if defined(UNTRUST)
	if( zIn == 0 ){
		return 0;
	}
#endif
	for(;;){
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;
		if( !zIn[0] ){ break; } zIn++;	
	}
	return (sxu32)(zIn - zSrc);
}